

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O1

void __thiscall
OmegaSN::OmegaSN(OmegaSN *this,vector<double,_std::allocator<double>_> *values,double firstdata,
                uint nbSeg,uint n)

{
  pointer pdVar1;
  double *pdVar2;
  double **ppdVar3;
  double ***pppdVar4;
  uint ***pppuVar5;
  uint **ppuVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint i;
  long lVar13;
  ulong uVar14;
  
  (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  pdVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar1;
  uVar9 = uVar12 >> 3;
  uVar8 = (uint)uVar9;
  this->nbStates = uVar8;
  this->nbSegments = nbSeg;
  uVar12 = uVar12 & 0x7fffffff8;
  pdVar2 = (double *)operator_new__(uVar12);
  this->states = pdVar2;
  if (uVar8 != 0) {
    uVar10 = 0;
    do {
      pdVar2[uVar10] = pdVar1[uVar10];
      uVar10 = uVar10 + 1;
    } while ((uVar9 & 0xffffffff) != uVar10);
  }
  ppdVar3 = (double **)operator_new__(0x18);
  this->S12P = ppdVar3;
  uVar10 = (ulong)(n + 1);
  lVar13 = 0;
  do {
    pdVar2 = (double *)operator_new__(uVar10 * 8);
    this->S12P[lVar13] = pdVar2;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  uVar11 = (ulong)nbSeg * 8;
  pppdVar4 = (double ***)operator_new__(uVar11);
  this->Q = pppdVar4;
  pppuVar5 = (uint ***)operator_new__(uVar11);
  this->lastChpt = pppuVar5;
  pppuVar5 = (uint ***)operator_new__(uVar11);
  this->lastIndState = pppuVar5;
  if (nbSeg != 0) {
    uVar11 = 0;
    do {
      ppdVar3 = (double **)operator_new__(uVar12);
      this->Q[uVar11] = ppdVar3;
      ppuVar6 = (uint **)operator_new__(uVar12);
      this->lastChpt[uVar11] = ppuVar6;
      ppuVar6 = (uint **)operator_new__(uVar12);
      this->lastIndState[uVar11] = ppuVar6;
      if (uVar8 != 0) {
        uVar14 = 0;
        do {
          pdVar2 = (double *)operator_new__(uVar10 * 8);
          this->Q[uVar11][uVar14] = pdVar2;
          puVar7 = (uint *)operator_new__(uVar10 << 2);
          this->lastChpt[uVar11][uVar14] = puVar7;
          puVar7 = (uint *)operator_new__(uVar10 << 2);
          this->lastIndState[uVar11][uVar14] = puVar7;
          uVar14 = uVar14 + 1;
        } while ((uVar9 & 0xffffffff) != uVar14);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != nbSeg);
  }
  return;
}

Assistant:

OmegaSN::OmegaSN(std::vector< double >& values, double firstdata, unsigned int nbSeg, unsigned int n)
{
  nbStates = values.size();
  nbSegments = nbSeg;
  states = new double[nbStates];
  for(unsigned int i = 0; i < nbStates; i++){states[i] = values[i];}

  ///
  /// MATRIX INITIALIZATION
  ///
  S12P = new double*[3]; ///matrix of vectors S1, S2 and SP
  for(unsigned int i = 0; i < 3; i++){S12P[i] = new double[n + 1];}

  Q = new double**[nbSegments];
  lastChpt = new unsigned int**[nbSegments];
  lastIndState = new unsigned int**[nbSegments];

  for(unsigned int i = 0; i < nbSegments; i++)
  {
    Q[i] = new double*[nbStates];
    lastChpt[i] = new unsigned int*[nbStates];
    lastIndState[i] = new unsigned int*[nbStates];
    for(unsigned int j = 0; j < nbStates; j++)
    {
      Q[i][j] = new double[n + 1];
      lastChpt[i][j] = new unsigned int[n + 1];
      lastIndState[i][j] = new unsigned int[n + 1];
    }
  }
}